

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void create_hostcache_id(char *name,int port,char *ptr,size_t buflen)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(name);
  if (sVar2 != 0) {
    sVar3 = 0xff;
    if (sVar2 < 0xff) {
      sVar3 = sVar2;
    }
    sVar2 = 0;
    do {
      iVar1 = tolower((uint)(byte)name[sVar2]);
      ptr[sVar2] = (char)iVar1;
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
    ptr = ptr + sVar2;
  }
  curl_msnprintf(ptr,7,":%u",port);
  return;
}

Assistant:

static void
create_hostcache_id(const char *name, int port, char *ptr, size_t buflen)
{
  size_t len = strlen(name);
  if(len > (buflen - 7))
    len = buflen - 7;
  /* store and lower case the name */
  while(len--)
    *ptr++ = (char)TOLOWER(*name++);
  msnprintf(ptr, 7, ":%u", port);
}